

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::
boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::increment(boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *this)

{
  size_t pos;
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  mapping_type *pmVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong pos_00;
  pointer pbVar8;
  uint *puVar9;
  pointer pbVar10;
  size_t sVar11;
  pointer pbVar12;
  
  uVar6 = this->current_;
  peVar2 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4;
  pos_00 = uVar7;
  if (uVar7 < uVar6) {
    pos_00 = uVar6;
  }
  puVar9 = (uint *)(uVar6 * 0x10 + lVar3 + 0x18);
  while( true ) {
    if (uVar7 <= uVar6) {
      update_current(this,pos_00);
      return;
    }
    pos = uVar6 + 1;
    if (uVar7 <= uVar6 + 2) break;
    uVar6 = uVar6 + 1;
    uVar1 = *puVar9;
    puVar9 = puVar9 + 4;
    if ((uVar1 & this->mask_) != 0) {
      update_current(this,pos);
      return;
    }
  }
  pmVar4 = this->map_;
  peVar2 = (pmVar4->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (peVar2->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  sVar11 = (long)pbVar10 - lVar3 >> 4;
  pbVar10 = pbVar10 + -1;
  pbVar12 = (pointer)(lVar3 + pos * 0x10);
  if (sVar11 == pos) {
    pbVar12 = pbVar10;
  }
  pbVar8 = (pointer)(this->current_ * 0x10 + lVar3);
  if (sVar11 == this->current_) {
    pbVar8 = pbVar10;
  }
  sVar11 = pbVar12->offset;
  sVar5 = pbVar8->offset;
  this->current_ = pos;
  (this->value_).iterator_._M_current = (this->value_).iterator_._M_current + (sVar11 - sVar5);
  peVar2 = (pmVar4->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(peVar2->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4 != pos) {
    (this->value_).rule_ = *(rule_type *)(lVar3 + 8 + pos * 0x10);
  }
  return;
}

Assistant:

void increment()
                    {
                        size_t next = current_;
                        while(next < size()) {
                            next++;
                            if(valid_offset(next))
                                break;
                        }
                        update_current(next);
                    }